

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O1

DecPOMDPDiscreteInterface * ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(Arguments *args)

{
  _Alloc_hider __haystack;
  TransitionObservationIndependentMADPDiscrete *this;
  ostream *poVar1;
  ProblemFireFightingFactored *this_00;
  char *pcVar2;
  FactoredDecPOMDPDiscreteInterface *pFVar3;
  Arguments *in_RDX;
  long lVar4;
  DecPOMDPDiscreteInterface *pDVar5;
  MADPParser parser;
  string dpomdpFile;
  string local_80;
  string local_60;
  string local_40;
  
  switch(args->problem_type) {
  case DT:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x250);
    ProblemDecTiger::ProblemDecTiger((ProblemDecTiger *)this_00);
    goto LAB_0038c9cf;
  case FF:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x290);
    ProblemFireFighting::ProblemFireFighting
              ((ProblemFireFighting *)this_00,args->nrAgents,args->nrHouses,args->nrFLs,0.0,false);
LAB_0038c9cf:
    lVar4 = *(long *)(*(long *)&(this_00->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x50);
    goto LAB_0038ca52;
  case FFF:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x790);
    ProblemFireFightingFactored::ProblemFireFightingFactored
              (this_00,args->nrAgents,args->nrHouses,args->nrFLs,0.0,false,args->extinguishProb,true
              );
    break;
  case FFG:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x790);
    ProblemFireFightingGraph::ProblemFireFightingGraph
              ((ProblemFireFightingGraph *)this_00,args->nrAgents,args->nrFLs,args->extinguishProb,
               true);
    break;
  default:
    directories::MADPGetProblemFilename_abi_cxx11_(&local_40,(directories *)args,in_RDX);
    __haystack._M_p = local_40._M_dataplus._M_p;
    if (args->isTOI == 0) {
      pcVar2 = strstr(local_40._M_dataplus._M_p,".pgmx");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(__haystack._M_p,".pomdp");
        if ((pcVar2 == (char *)0x0) &&
           (pcVar2 = strstr(__haystack._M_p,".POMDP"), pcVar2 == (char *)0x0)) {
          this = (TransitionObservationIndependentMADPDiscrete *)operator_new(0x230);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
          DecPOMDPDiscrete::DecPOMDPDiscrete((DecPOMDPDiscrete *)this,&local_80,&local_60,&local_40)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if (args->sparse != 0) {
            MultiAgentDecisionProcessDiscrete::SetSparse
                      ((MultiAgentDecisionProcessDiscrete *)this,true);
          }
          MADPParser::Parse((MADPParser *)&local_80,(DecPOMDPDiscrete *)this);
        }
        else {
          this = (TransitionObservationIndependentMADPDiscrete *)operator_new(0x230);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
          POMDPDiscrete::POMDPDiscrete((POMDPDiscrete *)this,&local_80,&local_60,&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if (args->sparse != 0) {
            MultiAgentDecisionProcessDiscrete::SetSparse
                      ((MultiAgentDecisionProcessDiscrete *)this,true);
          }
          MADPParser::Parse((MADPParser *)&local_80,(POMDPDiscrete *)this);
        }
        goto LAB_0038c8d1;
      }
      pFVar3 = GetFactoredDecPOMDPDiscreteInterfaceFromArgs(args);
      if (pFVar3 == (FactoredDecPOMDPDiscreteInterface *)0x0) {
        pDVar5 = (DecPOMDPDiscreteInterface *)0x0;
      }
      else {
        pDVar5 = (DecPOMDPDiscreteInterface *)
                 (&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xf0));
      }
    }
    else {
      this = (TransitionObservationIndependentMADPDiscrete *)operator_new(0x2e8);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
                ((TOIFactoredRewardDecPOMDPDiscrete *)this,&local_80,&local_60,&local_40,
                 args->cache_flat_models);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (args->sparse != 0) {
        TransitionObservationIndependentMADPDiscrete::SetSparse(this,true);
      }
      MADPParser::Parse((MADPParser *)&local_80,(TOIFactoredRewardDecPOMDPDiscrete *)this);
LAB_0038c8d1:
      pDVar5 = (DecPOMDPDiscreteInterface *)
               (&(this->super_MultiAgentDecisionProcess).field_0x0 +
               *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x50));
    }
    if (0 < args->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ArgumentUtils: Problem file ",0x1c);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," parsed",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0038ca55;
  case Aloha:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x748);
    ProblemAloha::ProblemAloha
              ((ProblemAloha *)this_00,args->islandConf,args->alohaVariation,args->maxBacklog,
               args->nrAgents,true);
  }
  if (args->cache_flat_models == true) {
    (**(code **)(*(long *)&(this_00->super_FactoredDecPOMDPDiscrete).
                           super_MultiAgentDecisionProcessDiscreteFactoredStates.
                           super_MultiAgentDecisionProcess + 0x300))(this_00,args->sparse != 0);
  }
  lVar4 = *(long *)(*(long *)&(this_00->super_FactoredDecPOMDPDiscrete).
                              super_MultiAgentDecisionProcessDiscreteFactoredStates.
                              super_MultiAgentDecisionProcess + -0x60);
LAB_0038ca52:
  pDVar5 = (DecPOMDPDiscreteInterface *)
           (&(this_00->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
             field_0x0 + lVar4);
LAB_0038ca55:
  if (0.0 < args->discount) {
    (**(code **)(*(long *)((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0)) + 0x68))
              ((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0));
  }
  if (0 < args->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ArgumentUtils: Problem ",0x17);
    (**(code **)(*(long *)((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0x40)) + 0x20))
              (&local_40,(long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0x40));
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," instantiated.",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return pDVar5;
}

Assistant:

DecPOMDPDiscreteInterface* GetDecPOMDPDiscreteInterfaceFromArgs(const Arguments& args)
{
    DecPOMDPDiscreteInterface * dp = 0;
    switch(args.problem_type) 
    {

        case(ProblemType::DT):
        {
            ProblemDecTiger* p = new ProblemDecTiger();            
            dp = p;
            break;
        }
        case(ProblemType::FF):
        {
            dp = new ProblemFireFighting(args.nrAgents, args.nrHouses, 
                    args.nrFLs);
            break;
        }
        case(ProblemType::FFF):
        {
            ProblemFireFightingFactored* p = 
                new ProblemFireFightingFactored(args.nrAgents,
                                                args.nrHouses,
                                                args.nrFLs,
                                                0.0,
                                                false,
                                                args.extinguishProb);
            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }
        case(ProblemType::FFG):
        {
            ProblemFireFightingGraph* p = 
                new ProblemFireFightingGraph(args.nrAgents,
                                             args.nrFLs,
                                             args.extinguishProb);
            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }
        case(ProblemType::Aloha):
        {
            ProblemAloha* p =
                new ProblemAloha(   args.islandConf,
                                    args.alohaVariation,
                                    args.maxBacklog,
                                    args.nrAgents );

            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }

        case(ProblemType::PARSE):
        default: //try to open the .dpomdp file and parse it
        {
            string dpomdpFile=directories::MADPGetProblemFilename(args);
            // load the DecPOMDP problem 
            if(args.isTOI)
            {
                TOIFactoredRewardDecPOMDPDiscrete *toi=
                    new TOIFactoredRewardDecPOMDPDiscrete("","",dpomdpFile,
                        args.cache_flat_models);
                if(args.sparse)
                    toi->SetSparse(true);
                MADPParser parser(toi);
#if 0 // this is done internally now
                if(args.cache_flat_models)
                {
                    if(args.sparse)
                        toi->CreateCentralizedSparseModels();
                    else
                        toi->CreateCentralizedFullModels();
                }                
#endif
                dp=toi;
            }
            else{
                if(strstr(dpomdpFile.c_str(),".pgmx"))
                    dp = GetFactoredDecPOMDPDiscreteInterfaceFromArgs(args);
                else if(
                        (strstr(dpomdpFile.c_str(),".pomdp"))
                    ||  (strstr(dpomdpFile.c_str(),".POMDP"))
                    )
                {
                    POMDPDiscrete* pomdp = 
                        new POMDPDiscrete("","",dpomdpFile);
                    if(args.sparse)
                        pomdp->SetSparse(true);
                    MADPParser parser(pomdp);
                    dp = pomdp;
                }
                else
                {
                    DecPOMDPDiscrete* decpomdp = 
                    new DecPOMDPDiscrete("","",dpomdpFile);
                    if(args.sparse)
                        decpomdp->SetSparse(true);
                    MADPParser parser(decpomdp);
                    dp = decpomdp;
                }
            }
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem file " << dpomdpFile << " parsed" << endl;
        }
    }
    if(args.discount > 0)
        dp->SetDiscount(args.discount);
            
    if(args.verbose > 0)
        cout << "ArgumentUtils: Problem " << dp->GetUnixName() 
             << " instantiated." << endl;

    return dp;
}